

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QFontMetrics __thiscall QPainter::fontMetrics(QPainter *this)

{
  bool bVar1;
  QPainterPrivate *this_00;
  QFont *in_RSI;
  QFontPrivate *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  QFont *in_stack_ffffffffffffff98;
  QExplicitlySharedDataPointer<QFontPrivate> file;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)
               (totally_ordered_wrapper<QFontPrivate_*>)in_RDI;
  this_00 = d_func((QPainter *)0x5945d7);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x5945ed);
  if (bVar1) {
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59464a);
    QFontMetrics::QFontMetrics((QFontMetrics *)in_RDI,in_stack_ffffffffffffff98);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)file.d.ptr,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff98);
    QMessageLogger::warning(local_38,"QPainter::fontMetrics: Painter not active");
    QFont::QFont(in_RSI);
    QFontMetrics::QFontMetrics((QFontMetrics *)in_RDI,in_stack_ffffffffffffff98);
    QFont::~QFont((QFont *)0x59463a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QFontPrivate>)
           (QExplicitlySharedDataPointer<QFontPrivate>)file.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QFontMetrics QPainter::fontMetrics() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::fontMetrics: Painter not active");
        return QFontMetrics(QFont());
    }
    return QFontMetrics(d->state->font);
}